

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::selectionStmt(Parse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  KeyWordTable *pKVar3;
  DelimiterTable *pDVar4;
  vector<QuadTuple,_std::allocator<QuadTuple>_> *pvVar5;
  pointer pTVar6;
  pointer pcVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  long lVar11;
  ostream *poVar12;
  char *pcVar13;
  QuadTuple local_2b8;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
    return 0;
  }
  pKVar3 = this->keyWordTable;
  paVar1 = &local_2b8.op.field_2;
  local_2b8.op._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"if","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&(pKVar3->
                          super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).index,&local_2b8.op);
  iVar9 = *pmVar10;
  iVar8 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].id;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.op._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8.op._M_dataplus._M_p,local_2b8.op.field_2._M_allocated_capacity + 1);
  }
  if (iVar9 != iVar8) {
    return 0;
  }
  lVar11 = (long)this->curIndex + 1;
  this->curIndex = (int)lVar11;
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar11].type == DELIMTER) {
    pDVar4 = this->delimiterTable;
    local_2b8.op._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"(","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&(pDVar4->
                            super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).index,&local_2b8.op);
    iVar9 = *pmVar10;
    iVar8 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.op._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b8.op._M_dataplus._M_p,local_2b8.op.field_2._M_allocated_capacity + 1);
    }
    if (iVar9 != iVar8) goto LAB_0010c93a;
    this->curIndex = this->curIndex + 1;
    pvVar5 = this->quadVec;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"if","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"__","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"__","");
    QuadTuple::QuadTuple(&local_2b8,&local_1f0,&local_50,&local_70,&local_90);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar5,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.res._M_dataplus._M_p != &local_2b8.res.field_2) {
      operator_delete(local_2b8.res._M_dataplus._M_p,local_2b8.res.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.name2._M_dataplus._M_p != &local_2b8.name2.field_2) {
      operator_delete(local_2b8.name2._M_dataplus._M_p,
                      local_2b8.name2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.name1._M_dataplus._M_p != &local_2b8.name1.field_2) {
      operator_delete(local_2b8.name1._M_dataplus._M_p,
                      local_2b8.name1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.op._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b8.op._M_dataplus._M_p,local_2b8.op.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    iVar8 = expression(this);
    iVar9 = this->curIndex;
    pTVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar8 == 0) {
      poVar12 = std::operator<<((ostream *)&std::cout,(string *)&pTVar6[iVar9].name);
      std::endl<char,std::char_traits<char>>(poVar12);
      pcVar13 = anon_var_dwarf_33cd0;
    }
    else {
      if (pTVar6[iVar9].type == DELIMTER) {
        pDVar4 = this->delimiterTable;
        local_2b8.op._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,")","");
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&(pDVar4->
                                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).index,&local_2b8.op);
        iVar8 = *pmVar10;
        iVar9 = this->curIndex;
        iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar9].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8.op._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b8.op._M_dataplus._M_p,
                          local_2b8.op.field_2._M_allocated_capacity + 1);
          iVar9 = this->curIndex;
        }
        if (iVar8 == iVar2) {
          this->curIndex = iVar9 + 1;
          pvVar5 = this->quadVec;
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"ifbegin","");
          pcVar7 = (this->curTmpName)._M_dataplus._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar7,pcVar7 + (this->curTmpName)._M_string_length);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"__","");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__","");
          QuadTuple::QuadTuple(&local_2b8,&local_210,&local_b0,&local_d0,&local_f0);
          std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                    (pvVar5,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8.res._M_dataplus._M_p != &local_2b8.res.field_2) {
            operator_delete(local_2b8.res._M_dataplus._M_p,
                            local_2b8.res.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8.name2._M_dataplus._M_p != &local_2b8.name2.field_2) {
            operator_delete(local_2b8.name2._M_dataplus._M_p,
                            local_2b8.name2.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8.name1._M_dataplus._M_p != &local_2b8.name1.field_2) {
            operator_delete(local_2b8.name1._M_dataplus._M_p,
                            local_2b8.name1.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8.op._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b8.op._M_dataplus._M_p,
                            local_2b8.op.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          iVar9 = statement(this);
          if (iVar9 != 0) {
            if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
LAB_0010c770:
              pvVar5 = this->quadVec;
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ifend","");
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"__","");
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"__","");
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"__","");
              QuadTuple::QuadTuple(&local_2b8,&local_170,&local_190,&local_1b0,&local_1d0);
              std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                        (pvVar5,&local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8.res._M_dataplus._M_p != &local_2b8.res.field_2) {
                operator_delete(local_2b8.res._M_dataplus._M_p,
                                local_2b8.res.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8.name2._M_dataplus._M_p != &local_2b8.name2.field_2) {
                operator_delete(local_2b8.name2._M_dataplus._M_p,
                                local_2b8.name2.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8.name1._M_dataplus._M_p != &local_2b8.name1.field_2) {
                operator_delete(local_2b8.name1._M_dataplus._M_p,
                                local_2b8.name1.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8.op._M_dataplus._M_p != paVar1) {
                operator_delete(local_2b8.op._M_dataplus._M_p,
                                local_2b8.op.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              return 1;
            }
            pKVar3 = this->keyWordTable;
            local_2b8.op._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"else","");
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&(pKVar3->
                                    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).index,&local_2b8.op);
            iVar9 = *pmVar10;
            iVar8 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[this->curIndex].id;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.op._M_dataplus._M_p != paVar1) {
              operator_delete(local_2b8.op._M_dataplus._M_p,
                              local_2b8.op.field_2._M_allocated_capacity + 1);
            }
            if (iVar9 != iVar8) goto LAB_0010c770;
            pvVar5 = this->quadVec;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"else","");
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"__","");
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"__","");
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"__","");
            QuadTuple::QuadTuple(&local_2b8,&local_110,&local_230,&local_130,&local_150);
            std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                      (pvVar5,&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.res._M_dataplus._M_p != &local_2b8.res.field_2) {
              operator_delete(local_2b8.res._M_dataplus._M_p,
                              local_2b8.res.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.name2._M_dataplus._M_p != &local_2b8.name2.field_2) {
              operator_delete(local_2b8.name2._M_dataplus._M_p,
                              local_2b8.name2.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.name1._M_dataplus._M_p != &local_2b8.name1.field_2) {
              operator_delete(local_2b8.name1._M_dataplus._M_p,
                              local_2b8.name1.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.op._M_dataplus._M_p != paVar1) {
              operator_delete(local_2b8.op._M_dataplus._M_p,
                              local_2b8.op.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            iVar9 = this->curIndex;
            this->curIndex = iVar9 + 1;
            iVar9 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar9 + 1].line;
            iVar8 = statement(this);
            if (iVar8 != 0) goto LAB_0010c770;
            poVar12 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33d1a);
            goto LAB_0010c9fe;
          }
          pcVar13 = anon_var_dwarf_33cf4;
          goto LAB_0010c9dc;
        }
      }
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
      std::endl<char,std::char_traits<char>>(poVar12);
      poVar12 = std::operator<<((ostream *)&std::cout,
                                (string *)
                                &(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)
                                 ._M_impl.super__Vector_impl_data._M_start[this->curIndex].name);
      std::endl<char,std::char_traits<char>>(poVar12);
      pcVar13 = anon_var_dwarf_33cdc;
    }
  }
  else {
LAB_0010c93a:
    pcVar13 = anon_var_dwarf_33cb6;
  }
LAB_0010c9dc:
  poVar12 = std::operator<<((ostream *)&std::cout,pcVar13);
  iVar9 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line;
LAB_0010c9fe:
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
  poVar12 = std::operator<<(poVar12,anon_var_dwarf_33a7e);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(0);
}

Assistant:

int Parse::selectionStmt() {
    if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["if"] == tokenVec[curIndex].id) {
        curIndex++;
        int line = tokenVec[curIndex].line;
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["("] == tokenVec[curIndex].id) {
            curIndex++;
            quadVec.emplace_back(QuadTuple("if", "__", "__", "__"));
        } else {
            cout << "if语句缺少左括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(!expression()) {
            cout << tokenVec[curIndex].name << endl;
            cout << "if语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[")"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << curIndex << endl;
            cout << tokenVec[curIndex].name  << endl;
            cout << "if语句缺少右括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        quadVec.emplace_back(QuadTuple("ifbegin", curTmpName, "__", "__"));
        //sem.pop();
        if(!statement()) {
            cout << "statement语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["else"] == tokenVec[curIndex].id) {
            quadVec.emplace_back(QuadTuple("else", "__", "__", "__"));
            curIndex++;
            int elseLine = tokenVec[curIndex].line;
            if(!statement()) {
                cout << "else 语句表达式错误在第"  << elseLine << "行" << endl;
                exit(0);
            }
        }
        quadVec.emplace_back(QuadTuple("ifend", "__", "__", "__"));
        return 1;
    }
    return 0;
}